

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sphere.cpp
# Opt level: O3

double __thiscall phyr::Sphere::pdf(Sphere *this,Interaction *ref,Vector3f *wi)

{
  Transform *pTVar1;
  bool bVar2;
  bool bVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  int i;
  int iVar8;
  long lVar9;
  long lVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  Point3f pOrigin;
  double local_18 [3];
  
  pTVar1 = (this->super_Shape).localToWorld;
  dVar12 = (pTVar1->mat).d[0][2] * 0.0 + (pTVar1->mat).d[0][0] * 0.0 + (pTVar1->mat).d[0][1] * 0.0 +
           (pTVar1->mat).d[0][3];
  dVar13 = (pTVar1->mat).d[1][2] * 0.0 + (pTVar1->mat).d[1][0] * 0.0 + (pTVar1->mat).d[1][1] * 0.0 +
           (pTVar1->mat).d[1][3];
  dVar15 = (pTVar1->mat).d[3][2] * 0.0 + (pTVar1->mat).d[3][0] * 0.0 + (pTVar1->mat).d[3][1] * 0.0 +
           (pTVar1->mat).d[3][3];
  bVar2 = NAN(dVar15);
  bVar3 = dVar15 == 1.0;
  dVar15 = 1.0 / dVar15;
  dVar11 = dVar12 * dVar15;
  if ((bVar3) && (!bVar2)) {
    dVar11 = dVar12;
  }
  dVar14 = (pTVar1->mat).d[2][2] * 0.0 + (pTVar1->mat).d[2][0] * 0.0 + (pTVar1->mat).d[2][1] * 0.0 +
           (pTVar1->mat).d[2][3];
  dVar12 = dVar13 * dVar15;
  if ((bVar3) && (!bVar2)) {
    dVar12 = dVar13;
  }
  dVar15 = dVar15 * dVar14;
  if ((bVar3) && (!bVar2)) {
    dVar15 = dVar14;
  }
  dVar13 = (ref->p).z;
  dVar14 = (ref->n).z;
  dVar4 = (ref->p).x;
  dVar5 = (ref->p).y;
  dVar6 = (ref->n).x;
  dVar7 = (ref->n).y;
  local_18[2] = (ABS(dVar6) * (ref->pfError).x + ABS(dVar7) * (ref->pfError).y +
                ABS(dVar14) * (ref->pfError).z) * 1024.0;
  local_18[0] = local_18[2] * dVar6;
  local_18[1] = local_18[2] * dVar7;
  local_18[2] = local_18[2] * dVar14;
  if ((dVar15 - dVar13) * dVar14 + (dVar11 - dVar4) * dVar6 + dVar7 * (dVar12 - dVar5) < 0.0) {
    local_18[0] = -local_18[0];
    local_18[1] = -local_18[1];
    local_18[2] = -local_18[2];
  }
  pOrigin.x = local_18[0] + dVar4;
  pOrigin.y = local_18[1] + dVar5;
  pOrigin.z = local_18[2] + dVar13;
  iVar8 = 0;
  do {
    lVar9 = 0;
    if (iVar8 != 0) {
      lVar9 = (ulong)(iVar8 != 1) * 8 + 8;
    }
    if (*(double *)((long)local_18 + lVar9) <= 0.0) {
      if (*(double *)((long)local_18 + lVar9) < 0.0) {
        dVar14 = *(double *)((long)&pOrigin.x + lVar9);
        lVar10 = -0x10000000000000;
        if (-INFINITY < dVar14) {
          dVar14 = (double)(~-(ulong)(dVar14 == 0.0) & (ulong)dVar14 |
                           -(ulong)(dVar14 == 0.0) & 0x8000000000000000);
          lVar10 = (long)dVar14 + (ulong)(dVar14 <= 0.0) * 2 + -1;
        }
        goto LAB_0013440f;
      }
    }
    else {
      dVar14 = *(double *)((long)&pOrigin.x + lVar9);
      lVar10 = 0x7ff0000000000000;
      if (dVar14 < INFINITY) {
        dVar14 = (double)(~-(ulong)(dVar14 == 0.0) & (ulong)dVar14);
        lVar10 = (-(ulong)(dVar14 < 0.0) | 1) + (long)dVar14;
      }
LAB_0013440f:
      *(long *)((long)&pOrigin.x + lVar9) = lVar10;
    }
    iVar8 = iVar8 + 1;
    if (iVar8 == 3) {
      dVar14 = this->radius * this->radius;
      if (dVar14 < (pOrigin.z - dVar15) * (pOrigin.z - dVar15) +
                   (pOrigin.x - dVar11) * (pOrigin.x - dVar11) +
                   (pOrigin.y - dVar12) * (pOrigin.y - dVar12)) {
        dVar15 = 1.0 - dVar14 / ((dVar13 - dVar15) * (dVar13 - dVar15) +
                                (dVar4 - dVar11) * (dVar4 - dVar11) +
                                (dVar5 - dVar12) * (dVar5 - dVar12));
        if (dVar15 <= 0.0) {
          dVar15 = 0.0;
        }
        dVar15 = uniformConePdf(SQRT(dVar15));
        return dVar15;
      }
      dVar15 = Shape::pdf(&this->super_Shape,ref,wi);
      return dVar15;
    }
  } while( true );
}

Assistant:

Real Sphere::pdf(const Interaction& ref, const Vector3f& wi) const {
    Point3f pCenter = (*localToWorld)(Point3f(0, 0, 0));
    // Return uniform PDF if point is inside sphere
    Point3f pOrigin =
        offsetRayOrigin(ref.p, ref.n, pCenter - ref.p, ref.pfError);
    if (distanceSquared(pOrigin, pCenter) <= radius * radius)
        return Shape::pdf(ref, wi);

    // Compute general sphere PDF
    Real sinThetaMax2 = radius * radius / distanceSquared(ref.p, pCenter);
    Real cosThetaMax = std::sqrt(std::max((Real)0, 1 - sinThetaMax2));
    return uniformConePdf(cosThetaMax);
}